

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewLine(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImVec2 local_8;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    if ((pIVar1->DC).CurrentLineHeight <= 0.0) {
      local_8 = (ImVec2)((ulong)(uint)pIVar2->FontSize << 0x20);
    }
    else {
      local_8.x = 0.0;
      local_8.y = 0.0;
    }
    ItemSize(&local_8,0.0);
  }
  return;
}

Assistant:

void ImGui::NewLine()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;
    if (window->DC.CurrentLineHeight > 0.0f)     // In the event that we are on a line with items that is smaller that FontSize high, we will preserve its height.
        ItemSize(ImVec2(0,0));
    else
        ItemSize(ImVec2(0.0f, GImGui->FontSize));
}